

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

int POOL_resize(POOL_ctx *ctx,size_t numThreads)

{
  ZSTD_allocFunction p_Var1;
  pthread_t *__ptr;
  ZSTD_freeFunction p_Var2;
  int iVar3;
  pthread_t *ppVar4;
  ulong uVar5;
  int iVar6;
  
  if (ctx == (POOL_ctx *)0x0) {
    iVar6 = 1;
  }
  else {
    pthread_mutex_lock((pthread_mutex_t *)&ctx->queueMutex);
    if (ctx->threadCapacity < numThreads) {
      p_Var1 = (ctx->customMem).customAlloc;
      if (p_Var1 == (ZSTD_allocFunction)0x0) {
        ppVar4 = (pthread_t *)malloc(numThreads * 8);
      }
      else {
        ppVar4 = (pthread_t *)(*p_Var1)((ctx->customMem).opaque,numThreads * 8);
      }
      iVar6 = 1;
      if (ppVar4 != (pthread_t *)0x0) {
        memcpy(ppVar4,ctx->threads,ctx->threadCapacity << 3);
        __ptr = ctx->threads;
        if (__ptr != (pthread_t *)0x0) {
          p_Var2 = (ctx->customMem).customFree;
          if (p_Var2 == (ZSTD_freeFunction)0x0) {
            free(__ptr);
          }
          else {
            (*p_Var2)((ctx->customMem).opaque,__ptr);
          }
        }
        ctx->threads = ppVar4;
        uVar5 = ctx->threadCapacity;
        if (uVar5 < numThreads) {
          ppVar4 = ppVar4 + uVar5;
          do {
            iVar3 = pthread_create(ppVar4,(pthread_attr_t *)0x0,POOL_thread,ctx);
            if (iVar3 != 0) {
              ctx->threadCapacity = uVar5;
              goto LAB_00108b49;
            }
            uVar5 = uVar5 + 1;
            ppVar4 = ppVar4 + 1;
          } while (numThreads != uVar5);
        }
        ctx->threadCapacity = numThreads;
        ctx->threadLimit = numThreads;
        iVar6 = 0;
      }
    }
    else if (numThreads == 0) {
      iVar6 = 1;
    }
    else {
      ctx->threadLimit = numThreads;
      iVar6 = 0;
    }
LAB_00108b49:
    pthread_cond_broadcast((pthread_cond_t *)&ctx->queuePopCond);
    pthread_mutex_unlock((pthread_mutex_t *)&ctx->queueMutex);
  }
  return iVar6;
}

Assistant:

int POOL_resize(POOL_ctx* ctx, size_t numThreads)
{
    int result;
    if (ctx==NULL) return 1;
    ZSTD_pthread_mutex_lock(&ctx->queueMutex);
    result = POOL_resize_internal(ctx, numThreads);
    ZSTD_pthread_cond_broadcast(&ctx->queuePopCond);
    ZSTD_pthread_mutex_unlock(&ctx->queueMutex);
    return result;
}